

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterators.hpp
# Opt level: O0

value_type __thiscall
protozero::
iterator_range<protozero::const_fixed_iterator<long>,_std::pair<protozero::const_fixed_iterator<long>,_protozero::const_fixed_iterator<long>_>_>
::front(iterator_range<protozero::const_fixed_iterator<long>,_std::pair<protozero::const_fixed_iterator<long>,_protozero::const_fixed_iterator<long>_>_>
        *this)

{
  bool bVar1;
  assert_error *this_00;
  value_type_conflict2 vVar2;
  iterator_range<protozero::const_fixed_iterator<long>,_std::pair<protozero::const_fixed_iterator<long>,_protozero::const_fixed_iterator<long>_>_>
  *this_local;
  
  bVar1 = empty(this);
  if (!bVar1) {
    vVar2 = const_fixed_iterator<long>::operator*((const_fixed_iterator<long> *)this);
    return vVar2;
  }
  this_00 = (assert_error *)__cxa_allocate_exception(0x10);
  assert_error::assert_error(this_00,"!empty()");
  __cxa_throw(this_00,&assert_error::typeinfo,assert_error::~assert_error);
}

Assistant:

value_type front() const {
        protozero_assert(!empty());
        return *(this->first);
    }